

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O0

void gdImageFilledArc(gdImagePtr im,int cx,int cy,int w,int h,int s,int e,int color,int style)

{
  int x2;
  int y2;
  int y;
  int x;
  int fy;
  int fx;
  int ly;
  int lx;
  int pti;
  int i;
  gdPoint pts [363];
  int local_24;
  int s_local;
  int h_local;
  int w_local;
  int cy_local;
  int cx_local;
  gdImagePtr im_local;
  
  fx = 0;
  fy = 0;
  x = 0;
  y = 0;
  if (s % 0x168 == e % 0x168) {
    local_24 = 0;
    e = 0x168;
  }
  else {
    local_24 = s;
    if (0x168 < s) {
      local_24 = s % 0x168;
    }
    if (0x168 < e) {
      e = e % 0x168;
    }
    for (; local_24 < 0; local_24 = local_24 + 0x168) {
    }
    for (; e < local_24; e = e + 0x168) {
    }
    if (local_24 == e) {
      local_24 = 0;
      e = 0x168;
    }
  }
  ly = 1;
  for (lx = local_24; lx <= e; lx = lx + 1) {
    x2 = (int)(((long)gdCosT[lx % 0x168] * (long)w) / 0x800) + cx;
    y2 = (int)(((long)gdSinT[lx % 0x168] * (long)h) / 0x800) + cy;
    if (lx == local_24) {
      y = y2;
      x = x2;
      if ((style & 3U) == 0) {
        pti = cx;
        i = cy;
        (&pti)[(long)ly * 2] = x2;
        pts[(long)ly + -1].y = y2;
      }
    }
    else if ((style & 1U) == 0) {
      if ((style & 2U) == 0) {
        if (y2 == fy) {
          ly = ly + -1;
          if ((((0x10e < lx) || (lx < 0x5a)) && (fx < x2)) ||
             (((0x5a < lx && (lx < 0x10e)) && (x2 < fx)))) {
            (&pti)[(long)ly * 2] = x2;
          }
        }
        else {
          (&pti)[(long)ly * 2] = x2;
          pts[(long)ly + -1].y = y2;
        }
      }
      else {
        gdImageLine(im,fx,fy,x2,y2,color);
      }
    }
    ly = ly + 1;
    fy = y2;
    fx = x2;
  }
  if ((style & 1U) == 0) {
    if ((style & 2U) == 0) {
      (&pti)[(long)ly * 2] = cx;
      pts[(long)ly + -1].y = cy;
      gdImageFilledPolygon(im,(gdPointPtr)&pti,ly + 1,color);
    }
    else if ((style & 4U) != 0) {
      gdImageLine(im,cx,cy,fx,fy,color);
      gdImageLine(im,cx,cy,x,y,color);
    }
  }
  else if ((style & 2U) == 0) {
    pti = x;
    i = y;
    pts[0].x = fx;
    pts[0].y = fy;
    pts[1].x = cx;
    pts[1].y = cy;
    gdImageFilledPolygon(im,(gdPointPtr)&pti,3,color);
  }
  else {
    if ((style & 4U) != 0) {
      gdImageLine(im,cx,cy,fx,fy,color);
      gdImageLine(im,cx,cy,x,y,color);
    }
    gdImageLine(im,x,y,fx,fy,color);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFilledArc (gdImagePtr im, int cx, int cy, int w, int h, int s, int e,
									int color, int style)
{
	gdPoint pts[363];
	int i, pti;
	int lx = 0, ly = 0;
	int fx = 0, fy = 0;

	if ((s % 360)  == (e % 360)) {
		s = 0;
		e = 360;
	} else {
		if (s > 360) {
			s = s % 360;
		}

		if (e > 360) {
			e = e % 360;
		}

		while (s < 0) {
			s += 360;
		}

		while (e < s) {
			e += 360;
		}

		if (s == e) {
			s = 0;
			e = 360;
		}
	}

	for (i = s, pti = 1; (i <= e); i++, pti++) {
		int x, y;
		x = ((long) gdCosT[i % 360] * (long) w / (2 * 1024)) + cx;
		y = ((long) gdSinT[i % 360] * (long) h / (2 * 1024)) + cy;
		if (i != s) {
			if (!(style & gdChord)) {
				if (style & gdNoFill) {
					gdImageLine (im, lx, ly, x, y, color);
				} else {
					if (y == ly) {
						pti--; /* don't add this point */
						if (((i > 270 || i < 90) && x > lx) || ((i >  90 && i < 270) && x < lx)) {
							/* replace the old x coord, if increasing on the
							   right side or decreasing on the left side */
							pts[pti].x = x;
						}
					} else {
						pts[pti].x = x;
						pts[pti].y = y;
					}
				}
			}
		} else {
			fx = x;
			fy = y;

			if (!(style & (gdChord | gdNoFill))) {
				pts[0].x = cx;
				pts[0].y = cy;
				pts[pti].x = x;
				pts[pti].y = y;
			}
		}
		lx = x;
		ly = y;
	}
	if (style & gdChord) {
		if (style & gdNoFill) {
			if (style & gdEdged) {
				gdImageLine (im, cx, cy, lx, ly, color);
				gdImageLine (im, cx, cy, fx, fy, color);
			}
			gdImageLine (im, fx, fy, lx, ly, color);
		} else {
			pts[0].x = fx;
			pts[0].y = fy;
			pts[1].x = lx;
			pts[1].y = ly;
			pts[2].x = cx;
			pts[2].y = cy;
			gdImageFilledPolygon (im, pts, 3, color);
		}
	} else {
		if (style & gdNoFill) {
			if (style & gdEdged) {
				gdImageLine (im, cx, cy, lx, ly, color);
				gdImageLine (im, cx, cy, fx, fy, color);
			}
		} else {
			pts[pti].x = cx;
			pts[pti].y = cy;
			gdImageFilledPolygon(im, pts, pti+1, color);
		}
	}
}